

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O1

vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
* __thiscall
burst::detail::
apply_impl<burst::make_range_vector_t_const&,std::tuple<std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&,std::vector<char,std::allocator<char>>const&>&,0ul,1ul,2ul>
          (vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
           *__return_storage_ptr__,undefined8 param_2,long *f)

{
  initializer_list<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>
  __l;
  allocator_type local_39;
  iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_38.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = *(char **)f[2];
  local_38.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = (char *)((undefined8 *)f[2])[1];
  local_28 = *(undefined8 *)f[1];
  uStack_20 = ((undefined8 *)f[1])[1];
  local_18 = *(undefined8 *)*f;
  uStack_10 = ((undefined8 *)*f)[1];
  __l._M_len = 3;
  __l._M_array = &local_38;
  std::
  vector<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<boost::iterator_range<__gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_39);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto)
            apply_impl
            (
                NaryFunction && f,
                Tuple && t,
                std::index_sequence<Indices...>
            )
        {
            return invoke(std::forward<NaryFunction>(f), std::get<Indices>(std::forward<Tuple>(t))...);
        }